

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

SRes LzmaEnc_SetProps(CLzmaEncHandle pp,CLzmaEncProps *props2)

{
  int iVar1;
  SRes SVar2;
  uint uVar3;
  CLzmaEncProps props;
  
  props.writeEndMark = props2->writeEndMark;
  props.numThreads = props2->numThreads;
  props.level = props2->level;
  props.dictSize = props2->dictSize;
  props.reduceSize = props2->reduceSize;
  props.lc = props2->lc;
  props.lp = props2->lp;
  props.pb = props2->pb;
  props.algo = props2->algo;
  props.fb = props2->fb;
  props.btMode = props2->btMode;
  props.numHashBytes = props2->numHashBytes;
  props.mc = props2->mc;
  LzmaEncProps_Normalize(&props);
  if ((props.dictSize < 0x60000001 && props.pb < 5) && (props.lp < 5 && props.lc < 9)) {
    *(UInt32 *)((long)pp + 0xac) = props.dictSize;
    uVar3 = 5;
    if (5 < (uint)props.fb) {
      uVar3 = props.fb;
    }
    if (0x110 < uVar3) {
      uVar3 = 0x111;
    }
    *(uint *)((long)pp + 0x44) = uVar3;
    *(int *)((long)pp + 0x60) = props.lc;
    *(int *)((long)pp + 100) = props.lp;
    *(int *)((long)pp + 0x68) = props.pb;
    *(uint *)((long)pp + 0x80) = (uint)(props.algo == 0);
    *(bool *)((long)pp + 0x121) = props.btMode != 0;
    if (props.btMode == 0) {
      iVar1 = 4;
    }
    else if (props.numHashBytes < 2) {
      iVar1 = 2;
    }
    else {
      iVar1 = 4;
      if ((uint)props.numHashBytes < 4) {
        iVar1 = props.numHashBytes;
      }
    }
    *(int *)((long)pp + 0x15c) = iVar1;
    *(UInt32 *)((long)pp + 0x13c) = props.mc;
    *(uint *)((long)pp + 0x84) = props.writeEndMark;
    SVar2 = 0;
  }
  else {
    SVar2 = 5;
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_SetProps(CLzmaEncHandle pp, const CLzmaEncProps *props2)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  CLzmaEncProps props = *props2;
  LzmaEncProps_Normalize(&props);

  if (props.lc > LZMA_LC_MAX
      || props.lp > LZMA_LP_MAX
      || props.pb > LZMA_PB_MAX
      || props.dictSize > ((UInt64)1 << kDicLogSizeMaxCompress)
      || props.dictSize > kMaxHistorySize)
    return SZ_ERROR_PARAM;

  p->dictSize = props.dictSize;
  {
    unsigned fb = props.fb;
    if (fb < 5)
      fb = 5;
    if (fb > LZMA_MATCH_LEN_MAX)
      fb = LZMA_MATCH_LEN_MAX;
    p->numFastBytes = fb;
  }
  p->lc = props.lc;
  p->lp = props.lp;
  p->pb = props.pb;
  p->fastMode = (props.algo == 0);
  p->matchFinderBase.btMode = (Byte)(props.btMode ? 1 : 0);
  {
    UInt32 numHashBytes = 4;
    if (props.btMode)
    {
      if (props.numHashBytes < 2)
        numHashBytes = 2;
      else if (props.numHashBytes < 4)
        numHashBytes = props.numHashBytes;
    }
    p->matchFinderBase.numHashBytes = numHashBytes;
  }

  p->matchFinderBase.cutValue = props.mc;

  p->writeEndMark = props.writeEndMark;

  #ifndef _7ZIP_ST
  /*
  if (newMultiThread != _multiThread)
  {
    ReleaseMatchFinder();
    _multiThread = newMultiThread;
  }
  */
  p->multiThread = (props.numThreads > 1);
  #endif

  return SZ_OK;
}